

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.h
# Opt level: O0

void __thiscall
nodecpp::log::Log::log<char_const*,unsigned_long>
          (Log *this,ModuleID *mid,LogLevel l,char *format_str,unsigned_long obj)

{
  bool bVar1;
  reference this_00;
  format_to_n_result<char_*> fVar2;
  ModuleID local_1070;
  reference local_1068;
  LogTransport *transport;
  iterator __end4;
  iterator __begin4;
  vector<nodecpp::log::LogTransport,_std::allocator<nodecpp::log::LogTransport>_> *__range4;
  format_to_n_result<char_*> r;
  char msgFormatted [4096];
  unsigned_long local_30;
  unsigned_long obj_local;
  char *format_str_local;
  ModuleID *pMStack_18;
  LogLevel l_local;
  ModuleID *mid_local;
  Log *this_local;
  
  if ((int)l <= (int)this->level) {
    local_30 = obj;
    obj_local = (unsigned_long)format_str;
    format_str_local._4_4_ = l;
    pMStack_18 = mid;
    mid_local = (ModuleID *)this;
    fVar2 = fmt::v7::format_to_n<char_*,_const_char_*,_unsigned_long,_0>
                      ((char *)&r.size,0xfff,(char **)&obj_local,&local_30);
    r.out = (char *)fVar2.size;
    if (r.out < (char *)0x1000) {
      *(char *)((long)&r.size + (long)r.out) = '\0';
    }
    __end4 = std::vector<nodecpp::log::LogTransport,_std::allocator<nodecpp::log::LogTransport>_>::
             begin(&this->transports);
    transport = (LogTransport *)
                std::vector<nodecpp::log::LogTransport,_std::allocator<nodecpp::log::LogTransport>_>
                ::end(&this->transports);
    while (bVar1 = __gnu_cxx::
                   operator==<nodecpp::log::LogTransport_*,_std::vector<nodecpp::log::LogTransport,_std::allocator<nodecpp::log::LogTransport>_>_>
                             (&__end4,(__normal_iterator<nodecpp::log::LogTransport_*,_std::vector<nodecpp::log::LogTransport,_std::allocator<nodecpp::log::LogTransport>_>_>
                                       *)&transport), ((bVar1 ^ 0xffU) & 1) != 0) {
      this_00 = __gnu_cxx::
                __normal_iterator<nodecpp::log::LogTransport_*,_std::vector<nodecpp::log::LogTransport,_std::allocator<nodecpp::log::LogTransport>_>_>
                ::operator*(&__end4);
      local_1068 = this_00;
      ModuleID::ModuleID(&local_1070,mid);
      LogTransport::writoToLog
                (this_00,&local_1070,(char *)&r.size,(size_t)r.out,format_str_local._4_4_,
                 (bool)(this->addTimeStamp & 1));
      __gnu_cxx::
      __normal_iterator<nodecpp::log::LogTransport_*,_std::vector<nodecpp::log::LogTransport,_std::allocator<nodecpp::log::LogTransport>_>_>
      ::operator++(&__end4);
    }
  }
  return;
}

Assistant:

void log( ModuleID mid, LogLevel l, StringT format_str, Objects ... obj ) {
			if ( l <= level ) {
				char msgFormatted[LogBufferBaseData::maxMessageSize];
				auto r = ::fmt::format_to_n( msgFormatted, LogBufferBaseData::maxMessageSize-1, format_str, obj ... );
				if ( r.size >= LogBufferBaseData::maxMessageSize )
					msgFormatted[LogBufferBaseData::maxMessageSize-1] = 0;
				else
					msgFormatted[r.size] = 0;
				for ( auto& transport : transports )
					transport.writoToLog( mid, msgFormatted, r.size, l, addTimeStamp );
			}				 
		}